

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# par2lpc.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  ostream *poVar4;
  int *actual_write_size;
  long in_RSI;
  int in_EDI;
  bool bVar5;
  ostringstream error_message_6;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> coefficients;
  int length;
  ostringstream error_message_4;
  Buffer buffer;
  ParcorCoefficientsToLinearPredictiveCoefficients
  parcor_coefficients_to_linear_predictive_coefficients;
  istream *input_stream;
  ostringstream error_message_3;
  ifstream ifs;
  ostringstream error_message_2;
  char *input_file;
  ostringstream error_message_1;
  int num_input_files;
  ostringstream error_message;
  int option_char;
  int num_order;
  option *in_stack_fffffffffffff0f8;
  Buffer *buffer_00;
  ostream *in_stack_fffffffffffff100;
  ParcorCoefficientsToLinearPredictiveCoefficients *in_stack_fffffffffffff108;
  allocator *paVar6;
  undefined4 in_stack_fffffffffffff110;
  int in_stack_fffffffffffff114;
  size_type in_stack_fffffffffffff118;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff120;
  istream *input_stream_00;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffff140;
  undefined8 in_stack_fffffffffffff148;
  int in_stack_fffffffffffff150;
  undefined1 in_stack_fffffffffffff156;
  char *local_ea8;
  undefined7 in_stack_fffffffffffff160;
  char *local_e60;
  allocator local_e11;
  string local_e10 [32];
  ostringstream local_df0 [216];
  ostringstream *in_stack_fffffffffffff2e8;
  string *in_stack_fffffffffffff2f0;
  allocator local_c71;
  string local_c70 [32];
  ostringstream local_c50 [383];
  istream local_ad1 [25];
  int local_ab8;
  allocator local_ab1;
  string local_ab0 [32];
  ostringstream local_a90 [408];
  ParcorCoefficientsToLinearPredictiveCoefficients local_8f8;
  char *local_8e8;
  undefined4 local_8e0;
  allocator local_8d9;
  string local_8d8 [32];
  ostringstream local_8b8 [376];
  char local_740 [527];
  allocator local_531;
  string local_530 [32];
  ostringstream local_510 [376];
  char *local_398;
  allocator local_389;
  string local_388 [32];
  ostringstream local_368 [376];
  int local_1f0;
  allocator local_1e9;
  string local_1e8 [32];
  ostringstream local_1c8 [399];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x19;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_18 = ya_getopt_long(in_stack_fffffffffffff114,(char **)in_stack_fffffffffffff108,
                                   (char *)in_stack_fffffffffffff100,in_stack_fffffffffffff0f8,
                                   (int *)0x1036ff), pcVar1 = ya_optarg, local_18 != -1) {
    if (local_18 == 0x68) {
      anon_unknown.dwarf_1727::PrintUsage(in_stack_fffffffffffff100);
      return 0;
    }
    if (local_18 != 0x6d) {
      anon_unknown.dwarf_1727::PrintUsage(in_stack_fffffffffffff100);
      return 1;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    bVar2 = sptk::ConvertStringToInteger
                      ((string *)in_stack_fffffffffffff108,(int *)in_stack_fffffffffffff100);
    bVar5 = local_14 < 0;
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (!bVar2 || bVar5) {
      std::__cxx11::ostringstream::ostringstream(local_1c8);
      poVar4 = std::operator<<((ostream *)local_1c8,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e8,"par2lpc",&local_1e9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
      local_4 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1c8);
      return local_4;
    }
  }
  local_1f0 = local_8 - ya_optind;
  if (1 < local_1f0) {
    std::__cxx11::ostringstream::ostringstream(local_368);
    std::operator<<((ostream *)local_368,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_388,"par2lpc",&local_389);
    sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
    std::__cxx11::string::~string(local_388);
    std::allocator<char>::~allocator((allocator<char> *)&local_389);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_368);
    return local_4;
  }
  if (local_1f0 == 0) {
    local_e60 = (char *)0x0;
  }
  else {
    local_e60 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_398 = local_e60;
  bVar2 = sptk::SetBinaryMode();
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_510);
    std::operator<<((ostream *)local_510,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_530,"par2lpc",&local_531);
    sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
    std::__cxx11::string::~string(local_530);
    std::allocator<char>::~allocator((allocator<char> *)&local_531);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_510);
    return local_4;
  }
  std::ifstream::ifstream(local_740);
  pcVar1 = local_398;
  if (local_398 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open(local_740,(_Ios_Openmode)pcVar1);
    bVar3 = std::ios::fail();
    if ((bVar3 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_8b8);
      poVar4 = std::operator<<((ostream *)local_8b8,"Cannot open file ");
      std::operator<<(poVar4,local_398);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_8d8,"par2lpc",&local_8d9);
      sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
      std::__cxx11::string::~string(local_8d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_8d9);
      local_4 = 1;
      local_8e0 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_8b8);
      goto LAB_0010442c;
    }
  }
  bVar3 = std::ifstream::is_open();
  if ((bVar3 & 1) == 0) {
    local_ea8 = (char *)&std::cin;
  }
  else {
    local_ea8 = local_740;
  }
  local_8e8 = local_ea8;
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::
  ParcorCoefficientsToLinearPredictiveCoefficients(&local_8f8,local_14);
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Buffer::Buffer((Buffer *)0x103ebc);
  bVar2 = sptk::ParcorCoefficientsToLinearPredictiveCoefficients::IsValid(&local_8f8);
  if (bVar2) {
    local_ab8 = local_14 + 1;
    actual_write_size = (int *)(long)local_ab8;
    input_stream_00 = local_ad1;
    std::allocator<double>::allocator((allocator<double> *)0x10406f);
    std::vector<double,_std::allocator<double>_>::vector
              (in_stack_fffffffffffff120,in_stack_fffffffffffff118,
               (allocator_type *)CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
    std::allocator<double>::~allocator((allocator<double> *)0x104095);
    do {
      buffer_00 = (Buffer *)0x0;
      bVar2 = sptk::ReadStream<double>
                        ((bool)in_stack_fffffffffffff156,in_stack_fffffffffffff150,
                         (int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                         (int)in_stack_fffffffffffff148,in_stack_fffffffffffff140,input_stream_00,
                         (int *)CONCAT17(bVar3,in_stack_fffffffffffff160));
      if (!bVar2) {
        local_4 = 0;
        local_8e0 = 1;
        goto LAB_001043d6;
      }
      bVar2 = sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Run
                        (in_stack_fffffffffffff108,
                         (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff100,
                         buffer_00);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_c50);
        poVar4 = std::operator<<((ostream *)local_c50,"Failed to convert PARCOR coefficients to ");
        std::operator<<(poVar4,"linear predictive coefficients");
        paVar6 = &local_c71;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_c70,"par2lpc",paVar6);
        sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
        std::__cxx11::string::~string(local_c70);
        std::allocator<char>::~allocator((allocator<char> *)&local_c71);
        local_4 = 1;
        local_8e0 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_c50);
        goto LAB_001043d6;
      }
      bVar2 = sptk::WriteStream<double>
                        (in_stack_fffffffffffff150,(int)((ulong)in_stack_fffffffffffff148 >> 0x20),
                         in_stack_fffffffffffff140,(ostream *)input_stream_00,actual_write_size);
      in_stack_fffffffffffff114 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff114);
    } while (bVar2);
    std::__cxx11::ostringstream::ostringstream(local_df0);
    std::operator<<((ostream *)local_df0,"Failed to write linear predictive coefficients");
    paVar6 = &local_e11;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e10,"par2lpc",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
    std::__cxx11::string::~string(local_e10);
    std::allocator<char>::~allocator((allocator<char> *)&local_e11);
    local_4 = 1;
    local_8e0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_df0);
LAB_001043d6:
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff114,in_stack_fffffffffffff110));
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_a90);
    poVar4 = std::operator<<((ostream *)local_a90,"Failed to initialize ");
    std::operator<<(poVar4,"ParcorCoefficientsToLinearPredictiveCoefficients");
    paVar6 = &local_ab1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ab0,"par2lpc",paVar6);
    sptk::PrintErrorMessage(in_stack_fffffffffffff2f0,in_stack_fffffffffffff2e8);
    std::__cxx11::string::~string(local_ab0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
    local_4 = 1;
    local_8e0 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_a90);
  }
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Buffer::~Buffer((Buffer *)0x104401);
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::
  ~ParcorCoefficientsToLinearPredictiveCoefficients(&local_8f8);
LAB_0010442c:
  std::ifstream::~ifstream(local_740);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("par2lpc", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::ParcorCoefficientsToLinearPredictiveCoefficients
      parcor_coefficients_to_linear_predictive_coefficients(num_order);
  sptk::ParcorCoefficientsToLinearPredictiveCoefficients::Buffer buffer;
  if (!parcor_coefficients_to_linear_predictive_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize "
                  << "ParcorCoefficientsToLinearPredictiveCoefficients";
    sptk::PrintErrorMessage("par2lpc", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &coefficients, &input_stream,
                          NULL)) {
    if (!parcor_coefficients_to_linear_predictive_coefficients.Run(
            &coefficients, &buffer)) {
      std::ostringstream error_message;
      error_message << "Failed to convert PARCOR coefficients to "
                    << "linear predictive coefficients";
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, coefficients, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write linear predictive coefficients";
      sptk::PrintErrorMessage("par2lpc", error_message);
      return 1;
    }
  }

  return 0;
}